

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTxInReference::AbstractTxInReference
          (AbstractTxInReference *this,AbstractTxIn *tx_in)

{
  this->_vptr_AbstractTxInReference = (_func_int **)&PTR__AbstractTxInReference_005b9fc8;
  Txid::Txid(&this->txid_,&tx_in->txid_);
  this->vout_ = tx_in->vout_;
  Script::Script(&this->unlocking_script_,&tx_in->unlocking_script_);
  this->sequence_ = tx_in->sequence_;
  ScriptWitness::ScriptWitness(&this->script_witness_,&tx_in->script_witness_);
  return;
}

Assistant:

AbstractTxInReference::AbstractTxInReference(const AbstractTxIn &tx_in)
    : txid_(tx_in.GetTxid()),
      vout_(tx_in.GetVout()),
      unlocking_script_(tx_in.GetUnlockingScript()),
      sequence_(tx_in.GetSequence()),
      script_witness_(tx_in.GetScriptWitness()) {
  // do nothing
}